

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskWriteCase::verifyImage
          (SampleMaskWriteCase *this,Surface *resultImage)

{
  int iVar1;
  bool bVar2;
  RenderTarget *pRVar3;
  int in_EDX;
  int extraout_EDX;
  TestLog *log;
  Vec3 local_40;
  ColorVerifier local_30;
  
  if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
      m_numRequestedSamples == 0) {
    bVar2 = true;
    if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
        m_renderTarget == TARGET_DEFAULT) {
      pRVar3 = Context::getRenderTarget
                         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                          super_MultisampleRenderCase.super_TestCase.m_context);
      bVar2 = pRVar3->m_numSamples < 2;
      in_EDX = extraout_EDX;
    }
  }
  else {
    bVar2 = false;
  }
  iVar1 = *(int *)&(this->super_SampleMaskBaseCase).field_0x12c;
  if (iVar1 == 1) {
    log = ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
           super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    if (bVar2) goto LAB_01234762;
LAB_0123478b:
    local_40.m_data[0] = 0.0;
    local_40.m_data[1] = 0.0;
  }
  else {
    if (iVar1 != 0) {
      return false;
    }
    if (!bVar2) {
      log = ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
             super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
            m_log;
      if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          m_numTargetSamples != 1) {
        local_30.super_Verifier._vptr_Verifier = (_func_int **)&PTR_verify_01e51db0;
        goto LAB_012347b1;
      }
      goto LAB_0123478b;
    }
    log = ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
           super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
LAB_01234762:
    local_40.m_data[0] = 0.0;
    local_40.m_data[1] = 1.0;
  }
  local_40.m_data[2] = 0.0;
  ColorVerifier::ColorVerifier(&local_30,&local_40,in_EDX);
LAB_012347b1:
  bVar2 = verifyImageWithVerifier(resultImage,log,&local_30.super_Verifier,true);
  return bVar2;
}

Assistant:

bool SampleMaskWriteCase::verifyImage (const tcu::Surface& resultImage)
{
	const bool singleSampleTarget = m_numRequestedSamples == 0 && !(m_renderTarget == TARGET_DEFAULT && m_context.getRenderTarget().getNumSamples() > 1);

	if (m_testMode == TEST_DISCARD)
	{
		if (singleSampleTarget)
		{
			// single sample case => multisample operations are not effective => don't discard anything
			// expect green
			return verifyImageWithVerifier(resultImage, m_testCtx.getLog(), ColorVerifier(tcu::Vec3(0.0f, 1.0f, 0.0f)));
		}
		else if (m_numTargetSamples == 1)
		{
			// total discard, expect black
			return verifyImageWithVerifier(resultImage, m_testCtx.getLog(), ColorVerifier(tcu::Vec3(0.0f, 0.0f, 0.0f)));
		}
		else
		{
			// partial discard, expect something between black and green
			return verifyImageWithVerifier(resultImage, m_testCtx.getLog(), PartialDiscardVerifier());
		}
	}
	else if (m_testMode == TEST_INVERSE)
	{
		if (singleSampleTarget)
		{
			// single sample case => multisample operations are not effective => don't discard anything
			// expect green
			return verifyImageWithVerifier(resultImage, m_testCtx.getLog(), ColorVerifier(tcu::Vec3(0.0f, 1.0f, 0.0f)));
		}
		else
		{
			// total discard, expect black
			return verifyImageWithVerifier(resultImage, m_testCtx.getLog(), ColorVerifier(tcu::Vec3(0.0f, 0.0f, 0.0f)));
		}
	}
	else
	{
		DE_ASSERT(false);
		return false;
	}
}